

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzidentifyrefpattern.cpp
# Opt level: O1

int __thiscall TPZIdentifyRefPattern::UniformSubElem(TPZIdentifyRefPattern *this,int eltype)

{
  int iVar1;
  long *plVar2;
  
  if ((uint)eltype < 8) {
    iVar1 = *(int *)(&DAT_015a537c + (ulong)(uint)eltype * 4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZIdentifyRefPattern::UniformSubElem ERROR unknown eltype : "
               ,0x3d);
    plVar2 = (long *)std::ostream::operator<<(&std::cerr,eltype);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int TPZIdentifyRefPattern::UniformSubElem( int eltype){
	switch (eltype) {
		case (EPoint)         : return TPZRefPoint::NSubEl;
		case (EOned)          : return TPZRefLinear::NSubEl;
		case (ETriangle)      : return TPZRefTriangle::NSubEl;
		case (EQuadrilateral) : return TPZRefQuad::NSubEl;
		case (ETetraedro)     : return TPZRefTetrahedra::NSubEl;
		case (EPiramide)      : return TPZRefPyramid::NSubEl;
		case (EPrisma)        : return TPZRefPrism::NSubEl;
		case (ECube)          : return TPZRefCube::NSubEl;
	}
	PZError << "TPZIdentifyRefPattern::UniformSubElem ERROR unknown eltype : " << eltype << endl;
	return (-1);
}